

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::peer_error_alert::~peer_error_alert(peer_error_alert *this)

{
  ~peer_error_alert(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_error_alert final : peer_alert
	{
		// internal
		peer_error_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, peer_id const& peer_id, operation_t op
			, error_code const& e);

		TORRENT_DEFINE_ALERT(peer_error_alert, 22)

		static constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;

		// a 0-terminated string of the low-level operation that failed, or nullptr if
		// there was no low level disk operation.
		operation_t op;

		// tells you what error caused this alert.
		error_code const error;

#if TORRENT_ABI_VERSION == 1
		int const TORRENT_DEPRECATED_MEMBER operation;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}